

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# planar_functions.cc
# Opt level: O0

int ARGBGrayTo(uint8_t *src_argb,int src_stride_argb,uint8_t *dst_argb,int dst_stride_argb,int width
              ,int height)

{
  int iVar1;
  int in_ECX;
  long in_RDX;
  int in_ESI;
  long in_RDI;
  uint in_R8D;
  int in_R9D;
  _func_void_uint8_t_ptr_uint8_t_ptr_int *ARGBGrayRow;
  int y;
  code *local_38;
  int local_30;
  uint local_28;
  int local_24;
  long local_20;
  int local_14;
  long local_10;
  int local_4;
  
  local_38 = ARGBGrayRow_C;
  if ((((in_RDI == 0) || (in_RDX == 0)) || ((int)in_R8D < 1)) || (in_R9D == 0)) {
    local_4 = -1;
  }
  else {
    local_14 = in_ESI;
    local_10 = in_RDI;
    if (in_R9D < 0) {
      in_R9D = -in_R9D;
      local_10 = in_RDI + (in_R9D + -1) * in_ESI;
      local_14 = -in_ESI;
    }
    local_28 = in_R8D;
    local_24 = in_ECX;
    if ((local_14 == in_R8D << 2) && (in_ECX == in_R8D << 2)) {
      local_28 = in_R9D * in_R8D;
      in_R9D = 1;
      local_24 = 0;
      local_14 = 0;
    }
    iVar1 = libyuv::TestCpuFlag(in_R9D);
    if ((iVar1 != 0) && ((local_28 & 7) == 0)) {
      local_38 = ARGBGrayRow_SSSE3;
    }
    local_20 = in_RDX;
    for (local_30 = 0; local_30 < in_R9D; local_30 = local_30 + 1) {
      (*local_38)(local_10,local_20,local_28);
      local_10 = local_10 + local_14;
      local_20 = local_20 + local_24;
    }
    local_4 = 0;
  }
  return local_4;
}

Assistant:

LIBYUV_API
int ARGBGrayTo(const uint8_t* src_argb,
               int src_stride_argb,
               uint8_t* dst_argb,
               int dst_stride_argb,
               int width,
               int height) {
  int y;
  void (*ARGBGrayRow)(const uint8_t* src_argb, uint8_t* dst_argb, int width) =
      ARGBGrayRow_C;
  if (!src_argb || !dst_argb || width <= 0 || height == 0) {
    return -1;
  }
  if (height < 0) {
    height = -height;
    src_argb = src_argb + (height - 1) * src_stride_argb;
    src_stride_argb = -src_stride_argb;
  }
  // Coalesce rows.
  if (src_stride_argb == width * 4 && dst_stride_argb == width * 4) {
    width *= height;
    height = 1;
    src_stride_argb = dst_stride_argb = 0;
  }
#if defined(HAS_ARGBGRAYROW_SSSE3)
  if (TestCpuFlag(kCpuHasSSSE3) && IS_ALIGNED(width, 8)) {
    ARGBGrayRow = ARGBGrayRow_SSSE3;
  }
#endif
#if defined(HAS_ARGBGRAYROW_NEON)
  if (TestCpuFlag(kCpuHasNEON) && IS_ALIGNED(width, 8)) {
    ARGBGrayRow = ARGBGrayRow_NEON;
  }
#endif
#if defined(HAS_ARGBGRAYROW_MMI)
  if (TestCpuFlag(kCpuHasMMI) && IS_ALIGNED(width, 2)) {
    ARGBGrayRow = ARGBGrayRow_MMI;
  }
#endif
#if defined(HAS_ARGBGRAYROW_MSA)
  if (TestCpuFlag(kCpuHasMSA) && IS_ALIGNED(width, 8)) {
    ARGBGrayRow = ARGBGrayRow_MSA;
  }
#endif

  for (y = 0; y < height; ++y) {
    ARGBGrayRow(src_argb, dst_argb, width);
    src_argb += src_stride_argb;
    dst_argb += dst_stride_argb;
  }
  return 0;
}